

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

StringList * __thiscall
Args::HelpPrinter::createUsageString
          (StringList *__return_storage_ptr__,HelpPrinter *this,ArgIface *arg,bool required)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined3 in_register_00000009;
  String usage;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (String *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  if (CONCAT31(in_register_00000009,required) == 0) {
    QString::QString((QString *)&local_50,"[ ");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  iVar1 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) != 0) {
    QString::QString((QString *)&local_50,"-");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    (*arg->_vptr_ArgIface[7])(arg);
    QString::append((QString *)&local_38);
    iVar1 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x10) != 0) {
      QString::QString((QString *)&local_50,",");
      QString::append((QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QList<Args::String>::emplaceBack<Args::String_const&>
                (__return_storage_ptr__,(String *)&local_38);
      QString::clear((QString *)&local_38);
    }
  }
  iVar1 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_01,iVar1) + 0x10) == 0) {
    iVar1 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x10) == 0) {
      iVar1 = (*arg->_vptr_ArgIface[8])(arg);
      if (*(long *)(CONCAT44(extraout_var_03,iVar1) + 0x10) == 0) {
        (*arg->_vptr_ArgIface[3])(&local_50,arg);
        QString::append((QString *)&local_38);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      }
    }
  }
  else {
    QString::QString((QString *)&local_50,"--");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    (*arg->_vptr_ArgIface[8])(arg);
    QString::append((QString *)&local_38);
  }
  iVar1 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar1 != '\0') {
    QString::QString((QString *)&local_50," <");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    (*arg->_vptr_ArgIface[9])(arg);
    QString::append((QString *)&local_38);
    QString::QString((QString *)&local_50,">");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (!required) {
    QString::QString((QString *)&local_50," ]");
    QString::append((QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QList<Args::String>::emplaceBack<Args::String_const&>(__return_storage_ptr__,(String *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}